

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O3

int ReadResponseLineAndHeaders
              (SOCKINFO *info,http_parser_t *parser,int *timeout_secs,int *http_error_code)

{
  parse_status_t pVar1;
  uint uVar2;
  int iVar3;
  char buf [2048];
  char acStack_838 [2056];
  
  pVar1 = parser_parse_responseline(parser);
  if (pVar1 != PARSE_OK) {
    if (pVar1 != PARSE_INCOMPLETE) {
      return pVar1;
    }
    do {
      uVar2 = sock_read(info,acStack_838,0x800,timeout_secs);
      if ((int)uVar2 < 1) goto LAB_0010ffb2;
      iVar3 = membuffer_append(&(parser->msg).msg,acStack_838,(ulong)uVar2);
      if (iVar3 != 0) goto LAB_0010ffbf;
      pVar1 = parser_parse_responseline(parser);
    } while (pVar1 == PARSE_INCOMPLETE);
    if (pVar1 != PARSE_OK) {
      return pVar1;
    }
  }
  pVar1 = parser_parse_headers(parser);
  if (pVar1 != PARSE_INCOMPLETE) {
    return pVar1;
  }
  while (uVar2 = sock_read(info,acStack_838,0x800,timeout_secs), 0 < (int)uVar2) {
    iVar3 = membuffer_append(&(parser->msg).msg,acStack_838,(ulong)uVar2);
    if (iVar3 != 0) {
LAB_0010ffbf:
      parser->http_error_code = 500;
      return 3;
    }
    pVar1 = parser_parse_headers(parser);
    if (pVar1 != PARSE_INCOMPLETE) {
      return pVar1;
    }
  }
LAB_0010ffb2:
  if (uVar2 == 0) {
    *http_error_code = 400;
    uVar2 = 0xffffff89;
  }
  else {
    *http_error_code = parser->http_error_code;
  }
  return uVar2;
}

Assistant:

static int ReadResponseLineAndHeaders(
	/*! Socket information object. */
	SOCKINFO *info,
	/*! HTTP Parser object. */
	http_parser_t *parser,
	/*! Time out value. */
	int *timeout_secs,
	/*! HTTP errror code returned. */
	int *http_error_code)
{
	parse_status_t status;
	int num_read;
	char buf[2 * 1024];
	int done = 0;
	int ret_code = 0;

	/*read response line */
	status = parser_parse_responseline(parser);
	switch (status) {
	case PARSE_OK:
		done = 1;
		break;
	case PARSE_INCOMPLETE:
		done = 0;
		break;
	default:
		/*error */
		return status;
	}
	while (!done) {
		num_read = sock_read(info, buf, sizeof(buf), timeout_secs);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(
				&parser->msg.msg, buf, (size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			status = parser_parse_responseline(parser);
			switch (status) {
			case PARSE_OK:
				done = 1;
				break;
			case PARSE_INCOMPLETE:
				done = 0;
				break;
			default:
				/*error */
				return status;
			}
		} else if (num_read == 0) {
			/* partial msg */
			*http_error_code = HTTP_BAD_REQUEST; /* or response */
			return UPNP_E_BAD_HTTPMSG;
		} else {
			*http_error_code = parser->http_error_code;
			return num_read;
		}
	}
	status = parser_parse_headers(parser);
	if ((status == (parse_status_t)PARSE_OK) &&
		(parser->position == (parser_pos_t)POS_ENTITY))
		done = 1;
	else if (status == (parse_status_t)PARSE_INCOMPLETE)
		done = 0;
	else
		/*error */
		return status;
	/*read headers */
	while (!done) {
		num_read = sock_read(info, buf, sizeof(buf), timeout_secs);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(
				&parser->msg.msg, buf, (size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			status = parser_parse_headers(parser);
			if (status == (parse_status_t)PARSE_OK &&
				parser->position == (parser_pos_t)POS_ENTITY)
				done = 1;
			else if (status == (parse_status_t)PARSE_INCOMPLETE)
				done = 0;
			else
				/*error */
				return status;
		} else if (num_read == 0) {
			/* partial msg */
			*http_error_code = HTTP_BAD_REQUEST; /* or response */
			return UPNP_E_BAD_HTTPMSG;
		} else {
			*http_error_code = parser->http_error_code;
			return num_read;
		}
	}

	return PARSE_OK;
}